

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void net_uv::TCPSocket::server_on_after_new_connection(uv_stream_t *server,int32_t status)

{
  undefined8 in_RAX;
  char *pcVar1;
  
  if (status != 0) {
    pcVar1 = uv_strerror(status);
    net_uvLog(3,"tcp new connection error %s",pcVar1,in_RAX);
    return;
  }
  std::function<void_(uv_stream_s_*,_int)>::operator()
            ((function<void_(uv_stream_s_*,_int)> *)((long)server->data + 0xa8),server,0);
  return;
}

Assistant:

void TCPSocket::server_on_after_new_connection(uv_stream_t *server, int32_t status) 
{
	if (status != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "tcp new connection error %s", uv_strerror(status));
		return;
	}
	TCPSocket* s = (TCPSocket*)server->data;
	s->m_newConnectionCall(server, status);
}